

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_stdlib.cpp
# Opt level: O0

bool ImGui::InputTextWithHint
               (char *label,char *hint,string *str,ImGuiInputTextFlags flags,
               ImGuiInputTextCallback callback,void *user_data)

{
  bool bVar1;
  char *buf;
  long lVar2;
  string *local_50;
  InputTextCallback_UserData cb_user_data;
  void *user_data_local;
  ImGuiInputTextCallback callback_local;
  ImGuiInputTextFlags flags_local;
  string *str_local;
  char *hint_local;
  char *label_local;
  
  cb_user_data.ChainCallbackUserData = user_data;
  if ((flags & 0x40000U) == 0) {
    local_50 = str;
    cb_user_data.Str = (string *)callback;
    cb_user_data.ChainCallback = (ImGuiInputTextCallback)user_data;
    buf = (char *)std::__cxx11::string::c_str();
    lVar2 = std::__cxx11::string::capacity();
    bVar1 = InputTextWithHint(label,hint,buf,lVar2 + 1,flags | 0x40000,InputTextCallback,&local_50);
    return bVar1;
  }
  __assert_fail("(flags & ImGuiInputTextFlags_CallbackResize) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/misc/cpp/imgui_stdlib.cpp"
                ,0x45,
                "bool ImGui::InputTextWithHint(const char *, const char *, std::string *, ImGuiInputTextFlags, ImGuiInputTextCallback, void *)"
               );
}

Assistant:

bool ImGui::InputTextWithHint(const char* label, const char* hint, std::string* str, ImGuiInputTextFlags flags, ImGuiInputTextCallback callback, void* user_data)
{
    IM_ASSERT((flags & ImGuiInputTextFlags_CallbackResize) == 0);
    flags |= ImGuiInputTextFlags_CallbackResize;

    InputTextCallback_UserData cb_user_data;
    cb_user_data.Str = str;
    cb_user_data.ChainCallback = callback;
    cb_user_data.ChainCallbackUserData = user_data;
    return InputTextWithHint(label, hint, (char*)str->c_str(), str->capacity() + 1, flags, InputTextCallback, &cb_user_data);
}